

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O2

string * __thiscall
PvrV3Header::ToCsvString_abi_cxx11_(string *__return_storage_ptr__,PvrV3Header *this)

{
  pointer __lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_48);
  ToStringArray_abi_cxx11_(&local_60,this);
  for (__lhs = local_60.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __lhs != local_60.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
    std::operator+(&local_48,__lhs,',');
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string ToCsvString() {
    std::string output("");
    const auto& variable_strings(this->ToStringArray());
    for(const auto& variable_string:variable_strings)
      output.append(variable_string + ',');
    return output;
  }